

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_tag.cpp
# Opt level: O2

void __thiscall
despot::TagSPParticleUpperBound::TagSPParticleUpperBound
          (TagSPParticleUpperBound *this,BaseTag *model)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  int iVar5;
  int s;
  long lVar6;
  Floor floor;
  Floor local_68;
  
  despot::ParticleUpperBound::ParticleUpperBound(&this->super_ParticleUpperBound);
  *(undefined ***)this = &PTR__TagSPParticleUpperBound_00121798;
  this->tag_model_ = model;
  (this->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  (this->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  (this->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  Floor::Floor(&local_68,&model->floor_);
  iVar5 = (**(code **)(*(long *)this->tag_model_ + 0x10))();
  std::vector<double,_std::allocator<double>_>::resize(&this->value_,(long)iVar5);
  lVar6 = 0;
  while( true ) {
    iVar5 = (**(code **)(*(long *)this->tag_model_ + 0x10))();
    if (iVar5 <= lVar6) break;
    dVar1 = (double)despot::Floor::Distance
                              ((int)&local_68,
                               (this->tag_model_->rob_).
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start[lVar6]);
    dVar2 = pow(_position,(double)(int)dVar1);
    dVar4 = _position;
    dVar3 = BaseTag::TAG_REWARD;
    dVar1 = pow(_position,(double)(int)dVar1);
    (this->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[lVar6] = dVar1 * dVar3 - (1.0 - dVar2) / (1.0 - dVar4);
    lVar6 = lVar6 + 1;
  }
  Floor::~Floor(&local_68);
  return;
}

Assistant:

TagSPParticleUpperBound(const BaseTag* model) :
		tag_model_(model) {
		Floor floor = tag_model_->floor_;
		value_.resize(tag_model_->NumStates());
		for (int s = 0; s < tag_model_->NumStates(); s++) {
			int rob = tag_model_->rob_[s], opp = tag_model_->opp_[s];
			int dist = (int) floor.Distance(rob, opp);
			value_[s] = -(1 - Globals::Discount(dist)) / (1 - Globals::Discount())
				+ tag_model_->TAG_REWARD * Globals::Discount(dist);
		}
	}